

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_node<0>(xml_document<char> *this,char **text)

{
  uchar uVar1;
  int iVar2;
  xml_node<char> *pxVar3;
  void *where;
  undefined8 uVar4;
  char **in_RSI;
  xml_document<char> *in_RDI;
  xml_document<char> *unaff_retaddr;
  char **in_stack_00000048;
  xml_document<char> *in_stack_00000050;
  void *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffdc;
  xml_document<char> *in_stack_ffffffffffffffe0;
  char **in_stack_fffffffffffffff8;
  
  iVar2 = (int)**in_RSI;
  if (iVar2 == 0x21) {
    iVar2 = (int)(*in_RSI)[1];
    if (iVar2 == 0x2d) {
      if ((*in_RSI)[2] == '-') {
        *in_RSI = *in_RSI + 3;
        pxVar3 = parse_comment<0>(in_RDI,in_RSI);
        return pxVar3;
      }
    }
    else if (iVar2 == 0x44) {
      if ((((((*in_RSI)[2] == 'O') && ((*in_RSI)[3] == 'C')) && ((*in_RSI)[4] == 'T')) &&
          (((*in_RSI)[5] == 'Y' && ((*in_RSI)[6] == 'P')))) &&
         (((*in_RSI)[7] == 'E' && (uVar1 = whitespace_pred::test((*in_RSI)[8]), uVar1 != '\0')))) {
        *in_RSI = *in_RSI + 9;
        pxVar3 = parse_doctype<0>(unaff_retaddr,in_stack_fffffffffffffff8);
        return pxVar3;
      }
    }
    else if ((((iVar2 == 0x5b) && ((*in_RSI)[2] == 'C')) &&
             (((*in_RSI)[3] == 'D' &&
              ((((*in_RSI)[4] == 'A' && ((*in_RSI)[5] == 'T')) && ((*in_RSI)[6] == 'A')))))) &&
            ((*in_RSI)[7] == '[')) {
      *in_RSI = *in_RSI + 8;
      pxVar3 = parse_cdata<0>(unaff_retaddr,in_stack_fffffffffffffff8);
      return pxVar3;
    }
    *in_RSI = *in_RSI + 1;
    while (**in_RSI != '>') {
      if (**in_RSI == '\0') {
        if (**in_RSI == '\0') {
          where = (void *)__cxa_allocate_exception(0x18);
          eof_error::eof_error
                    ((eof_error *)in_RDI,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),where);
          __cxa_throw(where,&eof_error::typeinfo,eof_error::~eof_error);
        }
        uVar4 = __cxa_allocate_exception(0x18);
        parse_error::parse_error
                  ((parse_error *)in_RDI,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                   in_stack_ffffffffffffffc0);
        __cxa_throw(uVar4,&parse_error::typeinfo,parse_error::~parse_error);
      }
      *in_RSI = *in_RSI + 1;
    }
    *in_RSI = *in_RSI + 1;
    pxVar3 = (xml_node<char> *)0x0;
  }
  else if (iVar2 == 0x3f) {
    *in_RSI = *in_RSI + 1;
    if (((**in_RSI == 'x') || (**in_RSI == 'X')) &&
       ((((*in_RSI)[1] == 'm' || ((*in_RSI)[1] == 'M')) &&
        ((((*in_RSI)[2] == 'l' || ((*in_RSI)[2] == 'L')) &&
         (uVar1 = whitespace_pred::test((*in_RSI)[3]), uVar1 != '\0')))))) {
      *in_RSI = *in_RSI + 4;
      pxVar3 = parse_xml_declaration<0>(in_RDI,in_RSI);
    }
    else {
      pxVar3 = parse_pi<0>(in_stack_ffffffffffffffe0,
                           (char **)CONCAT44(in_stack_ffffffffffffffdc,iVar2));
    }
  }
  else {
    pxVar3 = parse_element<0>(in_stack_00000050,in_stack_00000048);
  }
  return pxVar3;
}

Assistant:

xml_node<Ch> *parse_node(Ch *&text)
        {
            // Parse proper node type
            switch (text[0])
            {

            // <...
            default:
                // Parse and append element node
                return parse_element<Flags>(text);

            // <?...
            case Ch('?'):
                ++text;     // Skip ?
                if ((text[0] == Ch('x') || text[0] == Ch('X')) &&
                    (text[1] == Ch('m') || text[1] == Ch('M')) &&
                    (text[2] == Ch('l') || text[2] == Ch('L')) &&
                    whitespace_pred::test(text[3]))
                {
                    // '<?xml ' - xml declaration
                    text += 4;      // Skip 'xml '
                    return parse_xml_declaration<Flags>(text);
                }
                else
                {
                    // Parse PI
                    return parse_pi<Flags>(text);
                }

            // <!...
            case Ch('!'):

                // Parse proper subset of <! node
                switch (text[1])
                {

                // <!-
                case Ch('-'):
                    if (text[2] == Ch('-'))
                    {
                        // '<!--' - xml comment
                        text += 3;     // Skip '!--'
                        return parse_comment<Flags>(text);
                    }
                    break;

                // <![
                case Ch('['):
                    if (text[2] == Ch('C') && text[3] == Ch('D') && text[4] == Ch('A') &&
                        text[5] == Ch('T') && text[6] == Ch('A') && text[7] == Ch('['))
                    {
                        // '<![CDATA[' - cdata
                        text += 8;     // Skip '![CDATA['
                        return parse_cdata<Flags>(text);
                    }
                    break;

                // <!D
                case Ch('D'):
                    if (text[2] == Ch('O') && text[3] == Ch('C') && text[4] == Ch('T') &&
                        text[5] == Ch('Y') && text[6] == Ch('P') && text[7] == Ch('E') &&
                        whitespace_pred::test(text[8]))
                    {
                        // '<!DOCTYPE ' - doctype
                        text += 9;      // skip '!DOCTYPE '
                        return parse_doctype<Flags>(text);
                    }

                }   // switch

                // Attempt to skip other, unrecognized node types starting with <!
                ++text;     // Skip !
                while (*text != Ch('>'))
                {
                    if (*text == 0)
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                ++text;     // Skip '>'
                return 0;   // No node recognized

            }
        }